

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPsocket.h
# Opt level: O0

int __thiscall UDPsocket::bind(UDPsocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 in_register_00000034;
  sockaddr_in_t sVar2;
  int ret;
  int opt;
  undefined4 local_2c;
  sockaddr_in_t local_28;
  undefined8 local_18;
  UDPsocket *local_10;
  int local_4;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_10 = this;
  sVar2 = IPv4::operator_cast_to_sockaddr_in((IPv4 *)this);
  local_28._0_8_ = sVar2._0_8_;
  (this->self_addr).sin_family = local_28.sin_family;
  (this->self_addr).sin_port = local_28.sin_port;
  (this->self_addr).sin_addr = (in_addr)local_28.sin_addr.s_addr;
  local_28.sin_zero = sVar2.sin_zero;
  *&(this->self_addr).sin_zero = local_28.sin_zero;
  this->self_addr_len = 0x10;
  local_2c = 1;
  local_28 = sVar2;
  iVar1 = setsockopt(this->sock,1,2,&local_2c,4);
  if (iVar1 < 0) {
    local_4 = -5;
  }
  else {
    iVar1 = ::bind(this->sock,(sockaddr *)&this->self_addr,this->self_addr_len);
    if (iVar1 < 0) {
      local_4 = -4;
    }
    else {
      iVar1 = getsockname(this->sock,(sockaddr *)&this->self_addr,&this->self_addr_len);
      if (iVar1 < 0) {
        local_4 = -6;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int bind(const IPv4& ipaddr)
	{
		self_addr = ipaddr;
		self_addr_len = sizeof(self_addr);
		int opt = 1;
		int ret = ::setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (const char*)&opt, sizeof(opt));
		if (ret < 0) {
			return (int)Status::SetSockOptError;
		}
		ret = ::bind(sock, (sockaddr_t*)&self_addr, self_addr_len);
		if (ret < 0) {
			return (int)Status::BindError;
		}
		ret = ::getsockname(sock, (sockaddr_t*)&self_addr, &self_addr_len);
		if (ret < 0) {
			return (int)Status::GetSockNameError;
		}
		return (int)Status::OK;
	}